

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::FilesDiffer(string *source,string *destination)

{
  int iVar1;
  bool bVar2;
  size_t __n;
  ulong uVar3;
  stat statDestination;
  stat statSource;
  ifstream finDestination;
  ifstream finSource;
  char dest_buf [4096];
  char source_buf [4096];
  stat64 sStack_2568;
  stat64 local_24d8;
  long local_2448;
  size_t local_2440;
  byte abStack_2428 [488];
  long local_2240;
  size_t local_2238;
  byte abStack_2220 [488];
  undefined1 local_2038 [4096];
  undefined1 local_1038 [4104];
  
  iVar1 = stat64((source->_M_dataplus)._M_p,&local_24d8);
  bVar2 = true;
  if (iVar1 == 0) {
    iVar1 = stat64((destination->_M_dataplus)._M_p,&sStack_2568);
    bVar2 = true;
    if ((iVar1 == 0) && (local_24d8.st_size == sStack_2568.st_size)) {
      if (local_24d8.st_size == 0) {
        bVar2 = false;
      }
      else {
        std::ifstream::ifstream(&local_2240,(source->_M_dataplus)._M_p,_S_in);
        std::ifstream::ifstream(&local_2448,(destination->_M_dataplus)._M_p,_S_in);
        bVar2 = true;
        if (((abStack_2220[*(long *)(local_2240 + -0x18)] & 5) == 0) &&
           ((abStack_2428[*(long *)(local_2448 + -0x18)] & 5) == 0)) {
          uVar3 = local_24d8.st_size;
          while (bVar2 = 0 < (long)uVar3, 0 < (long)uVar3) {
            __n = 0x1000;
            if (uVar3 < 0x1000) {
              __n = uVar3;
            }
            std::istream::read((char *)&local_2240,(long)local_1038);
            std::istream::read((char *)&local_2448,(long)local_2038);
            if ((local_2238 != __n) || (local_2440 != __n)) break;
            iVar1 = bcmp(local_1038,local_2038,__n);
            uVar3 = uVar3 - __n;
            if (iVar1 != 0) break;
          }
        }
        std::ifstream::~ifstream(&local_2448);
        std::ifstream::~ifstream(&local_2240);
      }
    }
  }
  return bVar2;
}

Assistant:

bool SystemTools::FilesDiffer(const std::string& source,
                              const std::string& destination)
{

#if defined(_WIN32)
  WIN32_FILE_ATTRIBUTE_DATA statSource;
  if (GetFileAttributesExW(
        SystemTools::ConvertToWindowsExtendedPath(source).c_str(),
        GetFileExInfoStandard,
        &statSource) == 0)
    {
    return true;
    }

  WIN32_FILE_ATTRIBUTE_DATA statDestination;
  if (GetFileAttributesExW(
        SystemTools::ConvertToWindowsExtendedPath(destination).c_str(),
        GetFileExInfoStandard,
        &statDestination) == 0)
    {
    return true;
    }

  if(statSource.nFileSizeHigh != statDestination.nFileSizeHigh ||
     statSource.nFileSizeLow != statDestination.nFileSizeLow)
    {
    return true;
    }

  if(statSource.nFileSizeHigh == 0 && statSource.nFileSizeLow == 0)
    {
    return false;
    }
  off_t nleft = ((__int64)statSource.nFileSizeHigh << 32) +
                statSource.nFileSizeLow;

#else

  struct stat statSource;
  if (stat(source.c_str(), &statSource) != 0)
    {
    return true;
    }

  struct stat statDestination;
  if (stat(destination.c_str(), &statDestination) != 0)
    {
    return true;
    }

  if(statSource.st_size != statDestination.st_size)
    {
    return true;
    }

  if(statSource.st_size == 0)
    {
    return false;
    }
  off_t nleft = statSource.st_size;
#endif

#if defined(_WIN32)
  kwsys::ifstream finSource(source.c_str(),
                            (std::ios::binary |
                             std::ios::in));
  kwsys::ifstream finDestination(destination.c_str(),
                                 (std::ios::binary |
                                  std::ios::in));
#else
  kwsys::ifstream finSource(source.c_str());
  kwsys::ifstream finDestination(destination.c_str());
#endif
  if(!finSource || !finDestination)
    {
    return true;
    }

  // Compare the files a block at a time.
  char source_buf[KWSYS_ST_BUFFER];
  char dest_buf[KWSYS_ST_BUFFER];
  while(nleft > 0)
    {
    // Read a block from each file.
    std::streamsize nnext = (nleft > KWSYS_ST_BUFFER)? KWSYS_ST_BUFFER : static_cast<std::streamsize>(nleft);
    finSource.read(source_buf, nnext);
    finDestination.read(dest_buf, nnext);

    // If either failed to read assume they are different.
    if(static_cast<std::streamsize>(finSource.gcount()) != nnext ||
       static_cast<std::streamsize>(finDestination.gcount()) != nnext)
      {
      return true;
      }

    // If this block differs the file differs.
    if(memcmp(static_cast<const void*>(source_buf),
              static_cast<const void*>(dest_buf),
              static_cast<size_t>(nnext)) != 0)
      {
      return true;
      }

    // Update the byte count remaining.
    nleft -= nnext;
    }

  // No differences found.
  return false;
}